

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void Fl::paste(Fl_Widget *receiver,int clipboard,char *type)

{
  Display *pDVar1;
  Atom AVar2;
  Fl_Window *pFVar3;
  Atom AVar4;
  Window WVar5;
  
  AVar2 = TARGETS;
  pDVar1 = fl_display;
  if (fl_i_own_selection[clipboard] == '\0') {
    AVar4 = CLIPBOARD;
    if (clipboard == 0) {
      AVar4 = 1;
    }
    e_clipboard_type = type;
    fl_selection_requestor = receiver;
    pFVar3 = first_window();
    if (pFVar3->i == (Fl_X *)0x0) {
      WVar5 = 0;
    }
    else {
      WVar5 = pFVar3->i->xid;
    }
    XConvertSelection(pDVar1,AVar4,AVar2,AVar4,WVar5,fl_event_time);
    return;
  }
  if (fl_selection_type[clipboard] == "text/plain") {
    e_text = fl_selection_buffer[clipboard];
    e_length = fl_selection_length[clipboard];
    if (e_text == (char *)0x0) {
      e_text = "";
    }
    (*receiver->_vptr_Fl_Widget[3])(receiver,0x11);
    return;
  }
  return;
}

Assistant:

void Fl::paste(Fl_Widget &receiver, int clipboard, const char *type) {
  if (fl_i_own_selection[clipboard]) {
    // We already have it, do it quickly without window server.
    // Notice that the text is clobbered if set_selection is
    // called in response to FL_PASTE!
    // However, for now, we only paste text in this function
    if (fl_selection_type[clipboard] != Fl::clipboard_plain_text) return; //TODO: allow copy/paste of image within same app
    Fl::e_text = fl_selection_buffer[clipboard];
    Fl::e_length = fl_selection_length[clipboard];
    if (!Fl::e_text) Fl::e_text = (char *)"";
    receiver.handle(FL_PASTE);
    return;
  }
  // otherwise get the window server to return it:
  fl_selection_requestor = &receiver;
  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  Fl::e_clipboard_type = type;
  XConvertSelection(fl_display, property, TARGETS, property,
                    fl_xid(Fl::first_window()), fl_event_time);
}